

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O1

bool __thiscall
iDynTree::KinDynComputations::getRelativeJacobianSparsityPattern
          (KinDynComputations *this,FrameIndex refFrameIndex,FrameIndex frameIndex,
          MatrixDynSize *outJacobian)

{
  pointer peVar1;
  index_type iVar2;
  bool bVar3;
  MatrixView<double> local_60;
  
  iDynTree::Model::getNrOfDOFs();
  iDynTree::MatrixDynSize::resize((ulong)outJacobian,6);
  peVar1 = (pointer)iDynTree::MatrixDynSize::data();
  iVar2 = iDynTree::MatrixDynSize::rows();
  local_60.m_cols = iDynTree::MatrixDynSize::cols();
  local_60.m_storageOrder = RowMajor;
  local_60.m_innerStride = 1;
  local_60.m_storage = peVar1;
  local_60.m_rows = iVar2;
  local_60.m_outerStride = local_60.m_cols;
  bVar3 = getRelativeJacobianSparsityPattern(this,refFrameIndex,frameIndex,&local_60);
  return bVar3;
}

Assistant:

bool KinDynComputations::getRelativeJacobianSparsityPattern(const iDynTree::FrameIndex refFrameIndex,
                                                            const iDynTree::FrameIndex frameIndex,
                                                            iDynTree::MatrixDynSize & outJacobian) const
    {
        //I have the two links. Create the jacobian
        outJacobian.resize(6, pimpl->m_robot_model.getNrOfDOFs());

        return this->getRelativeJacobianSparsityPattern(refFrameIndex, frameIndex, MatrixView<double>(outJacobian));
    }